

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O3

void __thiscall
capnp::InputStreamMessageReader::InputStreamMessageReader
          (InputStreamMessageReader *this,InputStream *inputStream,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  Array<kj::ArrayPtr<const_capnp::word>_> *pAVar1;
  byte **ppbVar2;
  word *pwVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  ArrayPtr<const_capnp::word> *pAVar6;
  undefined8 uVar7;
  ArrayDisposer *pAVar8;
  Exception *pEVar9;
  Exception *pEVar10;
  ssize_t sVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  char *pcVar15;
  Context *elementCount;
  ReaderOptions options_00;
  uint segmentCount;
  undefined1 local_118 [16];
  Fault f;
  Context *local_d0;
  char *local_c8;
  ArrayDisposer *local_b8;
  WireValue<uint32_t> firstWord [2];
  Array<capnp::_::DirectWireValue<unsigned_int>_> moreSizes_heap;
  Fault f_1;
  ReaderOptions options_local;
  WireValue<uint32_t> moreSizes_stack [16];
  
  pEVar9 = (Exception *)scratchSpace.ptr;
  pcVar13 = (char *)options.traversalLimitInWords;
  options_00._12_4_ = 0;
  options_00.traversalLimitInWords = SUB128(options._0_12_,0);
  options_00.nestingLimit = SUB124(options._0_12_,8);
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__InputStreamMessageReader_0025f0b0;
  this->inputStream = inputStream;
  pAVar1 = &this->moreSegments;
  this->readPos = (byte *)0x0;
  (this->segment0).ptr = (word *)0x0;
  (this->segment0).size_ = 0;
  (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)0x0;
  (this->moreSegments).size_ = 0;
  (this->moreSegments).disposer = (ArrayDisposer *)0x0;
  (this->ownedSpace).ptr = (word *)0x0;
  (this->ownedSpace).size_ = 0;
  (this->ownedSpace).disposer = (ArrayDisposer *)0x0;
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  kj::InputStream::read(inputStream,(int)firstWord,(void *)0x8,8);
  pcVar15 = (char *)0x0;
  segmentCount = firstWord[0].value + 1;
  moreSizes_stack._0_8_ = &segmentCount;
  if (segmentCount != 0) {
    pcVar15 = (char *)(ulong)firstWord[1].value;
  }
  moreSizes_stack[2].value = 0x200;
  moreSizes_stack._16_8_ = anon_var_dwarf_86e4b;
  moreSizes_stack[6].value = 4;
  moreSizes_stack[7].value = 0;
  moreSizes_stack[8].value._0_1_ = segmentCount < 0x200;
  local_118._0_8_ = pcVar15;
  if (!(bool)(undefined1)moreSizes_stack[8].value) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[31]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xb5,FAILED,"segmentCount < 512","_kjCondition,\"Message has too many segments.\"",
               (DebugComparison<unsigned_int_&,_int> *)moreSizes_stack,
               (char (*) [31])"Message has too many segments.");
    segmentCount = 1;
    kj::_::Debug::Fault::~Fault(&f);
    pcVar15 = (char *)0x1;
  }
  elementCount = (Context *)(ulong)(segmentCount & 0xfffffffe);
  local_118._8_8_ = (char *)scratchSpace.size_;
  if ((segmentCount & 0xfffffffe) < 0x11) {
    pAVar8 = (ArrayDisposer *)moreSizes_stack;
    local_c8 = (char *)0x0;
    local_d0 = (Context *)0x0;
    local_b8 = (ArrayDisposer *)0x0;
  }
  else {
    pAVar8 = (ArrayDisposer *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (4,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    local_c8 = "P\x11&";
    local_d0 = elementCount;
    local_b8 = pAVar8;
  }
  if (1 < segmentCount) {
    kj::InputStream::read
              (inputStream,(int)pAVar8,(void *)((long)elementCount * 4),
               (size_t)((long)elementCount * 4));
    if (segmentCount - 1 != 0) {
      uVar12 = 0;
      do {
        local_118._0_8_ =
             local_118._0_8_ + (ulong)*(uint *)((long)&pAVar8->_vptr_ArrayDisposer + uVar12 * 4);
        uVar12 = uVar12 + 1;
      } while (segmentCount - 1 != uVar12);
    }
  }
  f.exception = (Exception *)local_118;
  if (pcVar13 < (ulong)local_118._0_8_) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[93]>
              (&f_1,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xc9,FAILED,"totalWords <= options.traversalLimitInWords",
               "_kjCondition,\"Message is too large.  To increase the limit on the receiving end, see \" \"capnp::ReaderOptions.\""
               ,(DebugComparison<unsigned_long_&,_unsigned_long_&> *)&f,
               (char (*) [93])
               "Message is too large.  To increase the limit on the receiving end, see capnp::ReaderOptions."
              );
    segmentCount = 1;
    if (pcVar13 < pcVar15) {
      pcVar15 = pcVar13;
    }
    local_118._0_8_ = pcVar15;
    kj::_::Debug::Fault::~Fault(&f_1);
  }
  uVar7 = local_118._0_8_;
  if ((ulong)local_118._8_8_ < (ulong)local_118._0_8_) {
    pEVar9 = (Exception *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (8,local_118._0_8_,local_118._0_8_,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    pwVar3 = (this->ownedSpace).ptr;
    f.exception = pEVar9;
    if (pwVar3 != (word *)0x0) {
      sVar4 = (this->ownedSpace).size_;
      (this->ownedSpace).ptr = (word *)0x0;
      (this->ownedSpace).size_ = 0;
      pAVar5 = (this->ownedSpace).disposer;
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pwVar3,8,sVar4,sVar4);
    }
    (this->ownedSpace).ptr = (word *)pEVar9;
    (this->ownedSpace).size_ = uVar7;
    (this->ownedSpace).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  }
  pcVar15 = (char *)((ulong)pcVar15 & 0xffffffff);
  (this->segment0).ptr = (word *)pEVar9;
  (this->segment0).size_ = (size_t)pcVar15;
  if (segmentCount < 2) {
LAB_001919a9:
    if (segmentCount == 0) goto LAB_001919f6;
    if (segmentCount != 1) {
      ppbVar2 = &this->readPos;
      *ppbVar2 = (byte *)pEVar9;
      sVar11 = kj::InputStream::read
                         (inputStream,(int)pEVar9,(void *)(local_118._0_8_ << 3),(long)pcVar15 << 3)
      ;
      *ppbVar2 = *ppbVar2 + sVar11;
      goto LAB_001919f6;
    }
  }
  else {
    uVar12 = (ulong)(segmentCount - 1);
    local_118._8_8_ = pcVar15;
    pEVar10 = (Exception *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x10,uVar12,uVar12,
                         kj::_::HeapArrayDisposer::Allocate_<kj::ArrayPtr<const_capnp::word>_>::
                         construct,
                         kj::ArrayDisposer::Dispose_<kj::ArrayPtr<const_capnp::word>_>::destruct);
    pAVar6 = pAVar1->ptr;
    f.exception = pEVar10;
    if (pAVar6 != (ArrayPtr<const_capnp::word> *)0x0) {
      sVar4 = (this->moreSegments).size_;
      pAVar1->ptr = (ArrayPtr<const_capnp::word> *)0x0;
      (this->moreSegments).size_ = 0;
      pAVar5 = (this->moreSegments).disposer;
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pAVar6,0x10,sVar4,sVar4);
    }
    (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)pEVar10;
    (this->moreSegments).size_ = uVar12;
    (this->moreSegments).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    if (segmentCount - 1 != 0) {
      lVar14 = 0;
      pcVar13 = (char *)local_118._8_8_;
      do {
        uVar12 = (ulong)*(uint *)((long)&pAVar8->_vptr_ArrayDisposer + lVar14);
        pcVar15 = pcVar13 + -0xd;
        pcVar13 = pcVar13 + uVar12;
        pAVar6 = pAVar1->ptr;
        *(void ***)((long)&pAVar6->ptr + lVar14 * 4) = pEVar9->trace + (long)pcVar15;
        *(ulong *)((long)&pAVar6->size_ + lVar14 * 4) = uVar12;
        lVar14 = lVar14 + 4;
        pcVar15 = (char *)local_118._8_8_;
      } while ((ulong)(segmentCount - 1) << 2 != lVar14);
      goto LAB_001919a9;
    }
  }
  kj::InputStream::read
            (inputStream,(int)pEVar9,(void *)(local_118._0_8_ << 3),(size_t)(local_118._0_8_ << 3));
LAB_001919f6:
  if (local_b8 != (ArrayDisposer *)0x0) {
    (*(code *)**(undefined8 **)local_c8)(local_c8,local_b8,4,local_d0,local_d0,0);
  }
  return;
}

Assistant:

InputStreamMessageReader::InputStreamMessageReader(
    kj::InputStream& inputStream, ReaderOptions options, kj::ArrayPtr<word> scratchSpace)
    : MessageReader(options), inputStream(inputStream), readPos(nullptr) {
  _::WireValue<uint32_t> firstWord[2];

  inputStream.read(kj::arrayPtr(firstWord).asBytes());

  uint segmentCount = firstWord[0].get() + 1;
  uint segment0Size = segmentCount == 0 ? 0 : firstWord[1].get();

  size_t totalWords = segment0Size;

  // Reject messages with too many segments for security reasons.
  KJ_REQUIRE(segmentCount < 512, "Message has too many segments.") {
    segmentCount = 1;
    segment0Size = 1;
    break;
  }

  // Read sizes for all segments except the first.  Include padding if necessary.
  KJ_STACK_ARRAY(_::WireValue<uint32_t>, moreSizes, segmentCount & ~1, 16, 64);
  if (segmentCount > 1) {
    inputStream.read(moreSizes.asBytes());
    for (uint i = 0; i < segmentCount - 1; i++) {
      totalWords += moreSizes[i].get();
    }
  }

  // Don't accept a message which the receiver couldn't possibly traverse without hitting the
  // traversal limit.  Without this check, a malicious client could transmit a very large segment
  // size to make the receiver allocate excessive space and possibly crash.
  KJ_REQUIRE(totalWords <= options.traversalLimitInWords,
             "Message is too large.  To increase the limit on the receiving end, see "
             "capnp::ReaderOptions.") {
    segmentCount = 1;
    segment0Size = kj::min(segment0Size, options.traversalLimitInWords);
    totalWords = segment0Size;
    break;
  }

  if (scratchSpace.size() < totalWords) {
    // TODO(perf):  Consider allocating each segment as a separate chunk to reduce memory
    //   fragmentation.
    ownedSpace = kj::heapArray<word>(totalWords);
    scratchSpace = ownedSpace;
  }

  segment0 = scratchSpace.first(segment0Size);

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);
    size_t offset = segment0Size;

    for (uint i = 0; i < segmentCount - 1; i++) {
      uint segmentSize = moreSizes[i].get();
      moreSegments[i] = scratchSpace.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  if (segmentCount == 1) {
    inputStream.read(scratchSpace.first(totalWords).asBytes());
  } else if (segmentCount > 1) {
    readPos = scratchSpace.asBytes().begin();
    readPos += inputStream.read(kj::arrayPtr(readPos, totalWords * sizeof(word)), segment0Size * sizeof(word));
  }
}